

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  BYTE *pBVar2;
  seqDef *psVar3;
  bool bVar4;
  undefined8 uVar5;
  U32 lowestValid;
  BYTE *pBVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong *puVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  U32 UVar21;
  size_t sVar22;
  ulong *puVar23;
  BYTE *litEnd;
  BYTE *pBVar24;
  BYTE *pBVar25;
  size_t offsetFound;
  BYTE *litLimit_w;
  BYTE *pInLoopLimit;
  uint local_a8;
  uint local_a4;
  size_t local_a0;
  ulong *local_98;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ZSTD_matchState_t *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  long local_58;
  uint *local_50;
  BYTE *local_48;
  seqStore_t *local_40;
  ulong *local_38;
  
  pBVar24 = (ms->window).base;
  uVar15 = (ms->window).dictLimit;
  local_48 = pBVar24 + uVar15;
  local_5c = *rep;
  puVar11 = (ulong *)((ulong)((int)src == (int)local_48) + (long)src);
  iVar14 = (int)puVar11 - (int)pBVar24;
  uVar20 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_60 = iVar14 - uVar20;
  if (iVar14 - uVar15 <= uVar20) {
    local_60 = uVar15;
  }
  if (ms->loadedDictEnd != 0) {
    local_60 = uVar15;
  }
  local_64 = rep[1];
  local_60 = iVar14 - local_60;
  local_a4 = local_64;
  if (local_60 < local_64) {
    local_a4 = 0;
  }
  local_a8 = local_5c;
  if (local_60 < local_5c) {
    local_a8 = 0;
  }
  local_98 = (ulong *)(srcSize + (long)src);
  local_90 = (ulong *)((long)src + (srcSize - 8));
  local_50 = rep;
  if (puVar11 < local_90) {
    puVar23 = (ulong *)((long)local_98 + -7);
    local_80 = (ulong *)((long)local_98 + -3);
    local_88 = (ulong *)((long)local_98 + -1);
    local_78 = local_98 + -4;
    local_70 = ms;
    local_40 = seqStore;
    local_38 = puVar23;
    do {
      local_58 = -(ulong)local_a8;
      if (local_a8 == 0) {
        pBVar24 = (BYTE *)0x0;
      }
      else {
        pBVar24 = (BYTE *)0x0;
        if (*(int *)(((long)puVar11 + 1) - (ulong)local_a8) == *(int *)((long)puVar11 + 1)) {
          puVar7 = (ulong *)((long)puVar11 + 5);
          puVar9 = (ulong *)((long)puVar11 + local_58 + 5);
          puVar13 = puVar7;
          if (puVar7 < puVar23) {
            uVar16 = *puVar7 ^ *puVar9;
            uVar8 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            pBVar24 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
            if (*puVar9 == *puVar7) {
              puVar13 = (ulong *)((long)puVar11 + 0xd);
              puVar9 = (ulong *)((long)puVar11 + local_58 + 0xd);
              do {
                if (puVar23 <= puVar13) goto LAB_001cc726;
                uVar8 = *puVar9;
                uVar16 = *puVar13;
                uVar18 = uVar16 ^ uVar8;
                uVar17 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                pBVar24 = (BYTE *)((long)puVar13 + ((uVar17 >> 3 & 0x1fffffff) - (long)puVar7));
                puVar13 = puVar13 + 1;
                puVar9 = puVar9 + 1;
              } while (uVar8 == uVar16);
            }
          }
          else {
LAB_001cc726:
            if ((puVar13 < local_80) && ((int)*puVar9 == (int)*puVar13)) {
              puVar13 = (ulong *)((long)puVar13 + 4);
              puVar9 = (ulong *)((long)puVar9 + 4);
            }
            if ((puVar13 < local_88) && ((short)*puVar9 == (short)*puVar13)) {
              puVar13 = (ulong *)((long)puVar13 + 2);
              puVar9 = (ulong *)((long)puVar9 + 2);
            }
            if (puVar13 < local_98) {
              puVar13 = (ulong *)((long)puVar13 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar13));
            }
            pBVar24 = (BYTE *)((long)puVar13 - (long)puVar7);
          }
          pBVar24 = pBVar24 + 4;
        }
      }
      local_a0 = 999999999;
      pBVar6 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                 (local_70,(BYTE *)puVar11,(BYTE *)local_98,&local_a0);
      pBVar25 = pBVar24;
      if (pBVar24 < pBVar6) {
        pBVar25 = pBVar6;
      }
      if (pBVar25 < (BYTE *)0x4) {
        puVar11 = (ulong *)((long)puVar11 + ((long)puVar11 - (long)src >> 8) + 1);
      }
      else {
        puVar7 = puVar11;
        sVar22 = local_a0;
        if (pBVar6 <= pBVar24) {
          puVar7 = (ulong *)((long)puVar11 + 1);
          sVar22 = 0;
        }
        if (puVar11 < local_90) {
          do {
            puVar13 = (ulong *)((long)puVar11 + 1);
            if (((sVar22 != 0) && (local_a8 != 0)) &&
               (*(int *)puVar13 == *(int *)((long)puVar13 + local_58))) {
              puVar9 = (ulong *)((long)puVar11 + 5);
              puVar10 = (ulong *)((long)puVar11 + local_58 + 5);
              puVar12 = puVar9;
              if (puVar9 < puVar23) {
                uVar16 = *puVar9 ^ *puVar10;
                uVar8 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                  }
                }
                pBVar24 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
                if (*puVar10 == *puVar9) {
                  puVar12 = (ulong *)((long)puVar11 + 0xd);
                  puVar10 = (ulong *)((long)puVar11 + local_58 + 0xd);
                  do {
                    if (puVar23 <= puVar12) goto LAB_001cc87d;
                    uVar8 = *puVar10;
                    uVar16 = *puVar12;
                    uVar18 = uVar16 ^ uVar8;
                    uVar17 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    pBVar24 = (BYTE *)((long)puVar12 + ((uVar17 >> 3 & 0x1fffffff) - (long)puVar9));
                    puVar12 = puVar12 + 1;
                    puVar10 = puVar10 + 1;
                  } while (uVar8 == uVar16);
                }
              }
              else {
LAB_001cc87d:
                if ((puVar12 < local_80) && ((int)*puVar10 == (int)*puVar12)) {
                  puVar12 = (ulong *)((long)puVar12 + 4);
                  puVar10 = (ulong *)((long)puVar10 + 4);
                }
                if ((puVar12 < local_88) && ((short)*puVar10 == (short)*puVar12)) {
                  puVar12 = (ulong *)((long)puVar12 + 2);
                  puVar10 = (ulong *)((long)puVar10 + 2);
                }
                if (puVar12 < local_98) {
                  puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar12));
                }
                pBVar24 = (BYTE *)((long)puVar12 - (long)puVar9);
              }
              if (pBVar24 < (BYTE *)0xfffffffffffffffc) {
                uVar20 = (int)sVar22 + 1;
                uVar15 = 0x1f;
                if (uVar20 != 0) {
                  for (; uVar20 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                if ((int)((uVar15 ^ 0x1f) + (int)pBVar25 * 3 + -0x1e) < (int)(pBVar24 + 4) * 3) {
                  sVar22 = 0;
                  puVar7 = puVar13;
                  pBVar25 = pBVar24 + 4;
                }
              }
            }
            local_a0 = 999999999;
            pBVar24 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                        (local_70,(BYTE *)puVar13,(BYTE *)local_98,&local_a0);
            puVar23 = local_38;
            bVar4 = true;
            if ((BYTE *)0x3 < pBVar24) {
              uVar20 = (int)sVar22 + 1;
              uVar15 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                }
              }
              uVar20 = (int)local_a0 + 1;
              iVar14 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                }
              }
              if ((int)((uVar15 ^ 0x1f) + (int)pBVar25 * 4 + -0x1b) < (int)pBVar24 * 4 - iVar14) {
                bVar4 = false;
                puVar7 = puVar13;
                sVar22 = local_a0;
                pBVar25 = pBVar24;
              }
            }
            if (bVar4) {
              if (local_90 <= puVar13) break;
              puVar13 = (ulong *)((long)puVar11 + 2);
              if (((sVar22 != 0) && (local_a8 != 0)) &&
                 (*(int *)puVar13 == *(int *)((long)puVar13 + local_58))) {
                puVar9 = (ulong *)((long)puVar11 + 6);
                puVar10 = (ulong *)((long)puVar11 + local_58 + 6);
                puVar12 = puVar9;
                if (puVar9 < local_38) {
                  uVar16 = *puVar9 ^ *puVar10;
                  uVar8 = 0;
                  if (uVar16 != 0) {
                    for (; (uVar16 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                    }
                  }
                  pBVar24 = (BYTE *)(uVar8 >> 3 & 0x1fffffff);
                  if (*puVar10 == *puVar9) {
                    puVar12 = (ulong *)((long)puVar11 + 0xe);
                    puVar10 = (ulong *)((long)puVar11 + local_58 + 0xe);
                    do {
                      if (local_38 <= puVar12) goto LAB_001cca08;
                      uVar8 = *puVar10;
                      uVar16 = *puVar12;
                      uVar18 = uVar16 ^ uVar8;
                      uVar17 = 0;
                      if (uVar18 != 0) {
                        for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                        }
                      }
                      pBVar24 = (BYTE *)((long)puVar12 + ((uVar17 >> 3 & 0x1fffffff) - (long)puVar9)
                                        );
                      puVar12 = puVar12 + 1;
                      puVar10 = puVar10 + 1;
                    } while (uVar8 == uVar16);
                  }
                }
                else {
LAB_001cca08:
                  if ((puVar12 < local_80) && ((int)*puVar10 == (int)*puVar12)) {
                    puVar12 = (ulong *)((long)puVar12 + 4);
                    puVar10 = (ulong *)((long)puVar10 + 4);
                  }
                  if ((puVar12 < local_88) && ((short)*puVar10 == (short)*puVar12)) {
                    puVar12 = (ulong *)((long)puVar12 + 2);
                    puVar10 = (ulong *)((long)puVar10 + 2);
                  }
                  if (puVar12 < local_98) {
                    puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar12));
                  }
                  pBVar24 = (BYTE *)((long)puVar12 - (long)puVar9);
                }
                if (pBVar24 < (BYTE *)0xfffffffffffffffc) {
                  uVar20 = (int)sVar22 + 1;
                  uVar15 = 0x1f;
                  if (uVar20 != 0) {
                    for (; uVar20 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                    }
                  }
                  if ((int)((uVar15 ^ 0x1f) + (int)pBVar25 * 4 + -0x1e) < (int)(pBVar24 + 4) * 4) {
                    sVar22 = 0;
                    puVar7 = puVar13;
                    pBVar25 = pBVar24 + 4;
                  }
                }
              }
              local_a0 = 999999999;
              pBVar24 = (BYTE *)ZSTD_BtFindBestMatch_selectMLS
                                          (local_70,(BYTE *)puVar13,(BYTE *)local_98,&local_a0);
              bVar4 = true;
              if ((BYTE *)0x3 < pBVar24) {
                uVar20 = (int)sVar22 + 1;
                uVar15 = 0x1f;
                if (uVar20 != 0) {
                  for (; uVar20 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                uVar20 = (int)local_a0 + 1;
                iVar14 = 0x1f;
                if (uVar20 != 0) {
                  for (; uVar20 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                  }
                }
                if ((int)((uVar15 ^ 0x1f) + (int)pBVar25 * 4 + -0x18) < (int)pBVar24 * 4 - iVar14) {
                  bVar4 = false;
                  puVar7 = puVar13;
                  sVar22 = local_a0;
                  pBVar25 = pBVar24;
                }
              }
              if (bVar4) break;
            }
            puVar11 = puVar13;
          } while (puVar11 < local_90);
        }
        if (sVar22 == 0) {
          UVar21 = 1;
        }
        else {
          if ((src < puVar7) && (local_48 < (BYTE *)((long)puVar7 + (2 - sVar22)))) {
            puVar11 = puVar7;
            while (puVar7 = puVar11,
                  *(BYTE *)((long)puVar11 + -1) == *(BYTE *)((long)puVar11 + (1 - sVar22))) {
              puVar7 = (ulong *)((long)puVar11 + -1);
              pBVar25 = pBVar25 + 1;
              if ((puVar7 <= src) ||
                 (pBVar24 = (BYTE *)((long)puVar11 + (1 - sVar22)), puVar11 = puVar7,
                 pBVar24 <= local_48)) break;
            }
          }
          UVar21 = (int)sVar22 + 1;
          local_a4 = local_a8;
          local_a8 = (int)sVar22 - 2;
        }
        uVar8 = (long)puVar7 - (long)src;
        if (local_78 < puVar7) {
          puVar13 = (ulong *)local_40->lit;
          puVar11 = puVar13;
          puVar9 = (ulong *)src;
          if (src <= local_78) {
            puVar11 = (ulong *)((long)puVar13 + ((long)local_78 - (long)src));
            uVar16 = *(ulong *)((long)src + 8);
            *puVar13 = *src;
            puVar13[1] = uVar16;
            puVar9 = local_78;
            if (0x10 < (long)local_78 - (long)src) {
              lVar19 = 0x10;
              do {
                uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar19) + 8);
                puVar1 = (undefined8 *)((long)puVar13 + lVar19);
                *puVar1 = *(undefined8 *)((long)src + lVar19);
                puVar1[1] = uVar5;
                pBVar24 = (BYTE *)((long)src + lVar19 + 0x10);
                uVar5 = *(undefined8 *)(pBVar24 + 8);
                puVar1[2] = *(undefined8 *)pBVar24;
                puVar1[3] = uVar5;
                lVar19 = lVar19 + 0x20;
              } while (puVar1 + 4 < puVar11);
            }
          }
          if (puVar9 < puVar7) {
            lVar19 = 0;
            do {
              *(BYTE *)((long)puVar11 + lVar19) = *(BYTE *)((long)puVar9 + lVar19);
              lVar19 = lVar19 + 1;
            } while ((long)puVar7 - (long)puVar9 != lVar19);
          }
        }
        else {
          puVar11 = (ulong *)local_40->lit;
          uVar16 = *(ulong *)((long)src + 8);
          *puVar11 = *src;
          puVar11[1] = uVar16;
          if (0x10 < uVar8) {
            pBVar24 = local_40->lit;
            uVar16 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar24 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar24 + 0x18) = uVar16;
            if (0x20 < (long)uVar8) {
              lVar19 = 0;
              do {
                pBVar2 = (BYTE *)((long)src + lVar19 + 0x20);
                uVar5 = *(undefined8 *)(pBVar2 + 8);
                pBVar6 = pBVar24 + lVar19 + 0x20;
                *(undefined8 *)pBVar6 = *(undefined8 *)pBVar2;
                *(undefined8 *)(pBVar6 + 8) = uVar5;
                pBVar2 = (BYTE *)((long)src + lVar19 + 0x30);
                uVar5 = *(undefined8 *)(pBVar2 + 8);
                *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)pBVar2;
                *(undefined8 *)(pBVar6 + 0x18) = uVar5;
                lVar19 = lVar19 + 0x20;
              } while (pBVar6 + 0x20 < pBVar24 + uVar8);
            }
          }
        }
        local_40->lit = local_40->lit + uVar8;
        if (0xffff < uVar8) {
          local_40->longLengthType = ZSTD_llt_literalLength;
          local_40->longLengthPos =
               (U32)((ulong)((long)local_40->sequences - (long)local_40->sequencesStart) >> 3);
        }
        psVar3 = local_40->sequences;
        psVar3->litLength = (U16)uVar8;
        psVar3->offset = UVar21;
        if ((BYTE *)0xffff < pBVar25 + -3) {
          local_40->longLengthType = ZSTD_llt_matchLength;
          local_40->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_40->sequencesStart) >> 3);
        }
        psVar3->matchLength = (U16)(pBVar25 + -3);
        local_40->sequences = psVar3 + 1;
        puVar11 = (ulong *)((long)puVar7 + (long)pBVar25);
        src = puVar11;
        if ((local_a4 != 0) && (uVar15 = local_a4, puVar11 <= local_90)) {
          while (uVar20 = local_a8, uVar8 = (ulong)uVar15, src = puVar11, local_a8 = uVar20,
                local_a4 = uVar15, (int)*puVar11 == *(int *)((long)puVar11 - uVar8)) {
            puVar7 = (ulong *)((long)puVar11 + 4);
            puVar9 = (ulong *)((long)puVar11 + (4 - uVar8));
            puVar13 = puVar7;
            if (puVar7 < puVar23) {
              uVar17 = *puVar7 ^ *puVar9;
              uVar16 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              pBVar24 = (BYTE *)(uVar16 >> 3 & 0x1fffffff);
              if (*puVar9 == *puVar7) {
                puVar13 = (ulong *)((long)puVar11 + 0xc);
                puVar9 = (ulong *)((long)puVar11 + (0xc - uVar8));
                do {
                  if (puVar23 <= puVar13) goto LAB_001ccd51;
                  uVar8 = *puVar9;
                  uVar16 = *puVar13;
                  uVar18 = uVar16 ^ uVar8;
                  uVar17 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  pBVar24 = (BYTE *)((long)puVar13 + ((uVar17 >> 3 & 0x1fffffff) - (long)puVar7));
                  puVar13 = puVar13 + 1;
                  puVar9 = puVar9 + 1;
                } while (uVar8 == uVar16);
              }
            }
            else {
LAB_001ccd51:
              if ((puVar13 < local_80) && ((int)*puVar9 == (int)*puVar13)) {
                puVar13 = (ulong *)((long)puVar13 + 4);
                puVar9 = (ulong *)((long)puVar9 + 4);
              }
              if ((puVar13 < local_88) && ((short)*puVar9 == (short)*puVar13)) {
                puVar13 = (ulong *)((long)puVar13 + 2);
                puVar9 = (ulong *)((long)puVar9 + 2);
              }
              if (puVar13 < local_98) {
                puVar13 = (ulong *)((long)puVar13 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar13));
              }
              pBVar24 = (BYTE *)((long)puVar13 - (long)puVar7);
            }
            if (puVar11 <= local_78) {
              puVar7 = (ulong *)local_40->lit;
              uVar8 = puVar11[1];
              *puVar7 = *puVar11;
              puVar7[1] = uVar8;
            }
            psVar3 = local_40->sequences;
            psVar3->litLength = 0;
            psVar3->offset = 1;
            if ((BYTE *)0xffff < pBVar24 + 1) {
              local_40->longLengthType = ZSTD_llt_matchLength;
              local_40->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)local_40->sequencesStart) >> 3);
            }
            psVar3->matchLength = (U16)(pBVar24 + 1);
            local_40->sequences = psVar3 + 1;
            puVar11 = (ulong *)((long)puVar11 + (long)(pBVar24 + 4));
            src = puVar11;
            local_a8 = uVar15;
            local_a4 = uVar20;
            if ((uVar20 == 0) || (uVar15 = uVar20, local_90 < puVar11)) break;
          }
        }
      }
    } while (puVar11 < local_90);
  }
  uVar15 = 0;
  if (local_60 < local_64) {
    uVar15 = local_64;
  }
  if (local_60 < local_5c) {
    uVar15 = local_5c;
  }
  if (local_a8 == 0) {
    local_a8 = uVar15;
  }
  if (local_a4 != 0) {
    uVar15 = local_a4;
  }
  *local_50 = local_a8;
  local_50[1] = uVar15;
  return (long)local_98 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}